

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typecheck.h
# Opt level: O0

kNode * TypeCheckNodeAt(KonohaContext *kctx,kNode *node,size_t pos,kNameSpace *ns,KClass *reqClass,
                       int pol)

{
  kNode *pkVar1;
  kNode *pkVar2;
  ulong in_RDX;
  kNameSpace *in_RSI;
  long in_RDI;
  kNode *texpr;
  kNode *expr;
  int in_stack_000000cc;
  KClass *in_stack_000000d0;
  kNameSpace *in_stack_000000d8;
  kNode *in_stack_000000e0;
  KonohaContext *in_stack_000000e8;
  
  if (((in_RSI->importedNameSpaceList->h).ct)->baseTypeId != 6) {
    __assert_fail("((((node->NodeList)->h.ct)->baseTypeId) == KType_Array)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/typecheck.h"
                  ,0xae,
                  "kNode *TypeCheckNodeAt(KonohaContext *, kNode *, size_t, kNameSpace *, KClass *, int)"
                 );
  }
  if (in_RDX < in_RSI->importedNameSpaceList->bytesize >> 3) {
    pkVar1 = (kNode *)(in_RSI->importedNameSpaceList->field_2).unboxItems[in_RDX];
    pkVar2 = TypeCheckNode(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,
                           in_stack_000000cc);
    if (pkVar2 != pkVar1) {
      (**(code **)(*(long *)(in_RDI + 0x10) + 0x240))
                (in_RSI->importedNameSpaceList,
                 (in_RSI->importedNameSpaceList->field_2).unboxItems[in_RDX],pkVar2);
      (in_RSI->importedNameSpaceList->field_2).unboxItems[in_RDX] = (uintptr_t)pkVar2;
      (**(code **)(*(long *)(in_RDI + 0x10) + 0x240))(pkVar2,(pkVar2->field_3).Parent,in_RSI);
      (pkVar2->field_3).RootNodeNameSpace = in_RSI;
    }
    return pkVar2;
  }
  __assert_fail("pos < (((node->NodeList)->bytesize)/sizeof(void *))",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/typecheck.h"
                ,0xaf,
                "kNode *TypeCheckNodeAt(KonohaContext *, kNode *, size_t, kNameSpace *, KClass *, int)"
               );
}

Assistant:

static kNode *TypeCheckNodeAt(KonohaContext *kctx, kNode *node, size_t pos, kNameSpace *ns, KClass *reqClass, int pol)
{
	DBG_ASSERT(IS_Array(node->NodeList));
	DBG_ASSERT(pos < kArray_size(node->NodeList));
	kNode *expr = node->NodeList->NodeItems[pos];
	//kNode_SetParent(kctx, expr, node);
	//DBG_ASSERT(kNode_GetParentNULL(expr) == node);
	kNode *texpr = TypeCheckNode(kctx, expr, ns, reqClass, pol);
	if(texpr != expr) {
		KFieldSet(node->NodeList, node->NodeList->NodeItems[pos], texpr);
		kNode_SetParent(kctx, texpr, node);
	}
	return texpr;
}